

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManPrintStats(Fxch_Man_t *pFxchMan)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = Vec_WecSizeUsed(pFxchMan->vCubes);
  printf("Cubes =%8d  ",(ulong)uVar2);
  uVar2 = Vec_WecSizeUsed(pFxchMan->vLits);
  printf("Lits  =%8d  ",(ulong)uVar2);
  printf("Divs  =%8d  ",(ulong)(uint)pFxchMan->pDivHash->vMap->nSize);
  iVar1 = pFxchMan->vDivPrio->nSize;
  if (0 < iVar1) {
    printf("Divs+ =%8d  ",(ulong)(iVar1 - 1));
    printf("Extr  =%7d  \n",(ulong)(uint)pFxchMan->nExtDivs);
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                ,0x88,"int Vec_QueSize(Vec_Que_t *)");
}

Assistant:

void Fxch_ManPrintStats( Fxch_Man_t* pFxchMan )
{
    printf( "Cubes =%8d  ", Vec_WecSizeUsed( pFxchMan->vCubes ) );
    printf( "Lits  =%8d  ", Vec_WecSizeUsed( pFxchMan->vLits ) );
    printf( "Divs  =%8d  ", Hsh_VecSize( pFxchMan->pDivHash ) );
    printf( "Divs+ =%8d  ", Vec_QueSize( pFxchMan->vDivPrio ) );
    printf( "Extr  =%7d  \n", pFxchMan->nExtDivs );
}